

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  Vec_Int_t *pVVar1;
  Vec_Wrd_t *pVVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  uint *puVar7;
  Hsh_IntObj_t *pHVar8;
  uint *__s2;
  word *pwVar9;
  ulong uVar10;
  Vec_Wrd_t *pVVar11;
  int iVar12;
  int *piVar13;
  
  pVVar1 = p->vTable;
  if (pVVar1->nSize < p->vObjs->nSize) {
    uVar3 = Abc_PrimeCudd(pVVar1->nSize * 2);
    if (pVVar1->nCap < (int)uVar3) {
      if (pVVar1->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar5 = (int *)realloc(pVVar1->pArray,(long)(int)uVar3 << 2);
      }
      pVVar1->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar1->nCap = uVar3;
    }
    uVar6 = 0;
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = uVar6;
    }
    for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      pVVar1->pArray[uVar6] = -1;
    }
    pVVar1->nSize = uVar3;
    for (iVar12 = 0; iVar12 < p->vObjs->nSize; iVar12 = iVar12 + 1) {
      pVVar1 = p->vTable;
      puVar7 = Hsh_IntData(p,iVar12);
      iVar4 = Hsh_IntManHash(puVar7,p->nSize,p->vTable->nSize);
      piVar5 = Vec_IntEntryP(pVVar1,iVar4);
      iVar4 = *piVar5;
      pHVar8 = Hsh_IntObj(p,iVar12);
      pHVar8->iNext = iVar4;
      *piVar5 = iVar12;
    }
  }
  puVar7 = Hsh_IntData(p,iData);
  pVVar1 = p->vTable;
  iVar12 = Hsh_IntManHash(puVar7,p->nSize,pVVar1->nSize);
  piVar5 = Vec_IntEntryP(pVVar1,iVar12);
  do {
    piVar13 = piVar5;
    pHVar8 = Hsh_IntObj(p,*piVar13);
    if (pHVar8 == (Hsh_IntObj_t *)0x0) {
      if (*piVar13 != -1) {
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                      ,0x9a,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
      }
      goto LAB_003708aa;
    }
    __s2 = Hsh_IntData(p,pHVar8->iData);
    iVar12 = bcmp(puVar7,__s2,(long)p->nSize << 2);
    piVar5 = &pHVar8->iNext;
  } while (iVar12 != 0);
  if (*piVar13 == -1) {
LAB_003708aa:
    pVVar2 = p->vObjs;
    iVar12 = pVVar2->nSize;
    *piVar13 = iVar12;
    pVVar11 = pVVar2;
    if (iVar12 == pVVar2->nCap) {
      uVar3 = 0x10;
      if (0xf < iVar12) {
        uVar3 = iVar12 * 2;
      }
      if (iVar12 < (int)uVar3) {
        if (pVVar2->pArray == (word *)0x0) {
          pwVar9 = (word *)malloc((ulong)uVar3 << 3);
        }
        else {
          pwVar9 = (word *)realloc(pVVar2->pArray,(ulong)uVar3 << 3);
        }
        pVVar2->pArray = pwVar9;
        if (pwVar9 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar2->nCap = uVar3;
        iVar12 = pVVar2->nSize;
        pVVar11 = p->vObjs;
      }
    }
    pVVar2->nSize = iVar12 + 1;
    pVVar2->pArray[iVar12] = (ulong)(uint)iData | 0xffffffff00000000;
    iVar12 = pVVar11->nSize + -1;
  }
  else {
    pHVar8 = Hsh_IntObj(p,*piVar13);
    iVar12 = (int)((ulong)((long)pHVar8 - (long)p->vObjs->pArray) >> 3);
  }
  return iVar12;
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, i), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}